

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1.h
# Opt level: O1

void ncnn::im2col_sgemm_pack8to1_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint _h;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  float fVar10;
  int *piVar11;
  undefined1 (*pauVar12) [32];
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  _func_int ***ppp_Var19;
  undefined1 (*pauVar20) [32];
  long lVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [32];
  int iVar24;
  undefined1 (*pauVar25) [32];
  uint uVar26;
  undefined1 (*pauVar27) [32];
  undefined1 (*pauVar28) [32];
  undefined1 (*pauVar29) [32];
  ulong uVar30;
  float *pfVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [32];
  uint uVar34;
  long lVar35;
  undefined1 auVar36 [16];
  float fVar37;
  float fVar45;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar43;
  float fVar44;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float zeros [8];
  undefined1 (*local_f8) [32];
  Mat local_d8;
  ulong local_90;
  ulong local_88;
  long local_80;
  ulong local_78;
  undefined1 (*local_70) [32];
  ulong local_68;
  Mat *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar3 = bottom_im2col->w;
  uVar30 = (ulong)(int)uVar3;
  uVar4 = bottom_im2col->h;
  uVar32 = (ulong)uVar4;
  _h = bottom_im2col->c;
  uVar15 = (ulong)_h;
  local_80 = (long)top_blob->c;
  pvVar5 = _bias->data;
  local_d8.cstep = 0;
  local_d8.data = (Allocator *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elempack = 0;
  uVar26 = uVar4 * 8;
  if ((long)uVar30 < 8) {
    uVar26 = uVar4;
  }
  local_d8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  uVar17 = (uVar3 & 7) + (uVar3 >> 3);
  if ((long)uVar30 < 8) {
    uVar17 = uVar3;
  }
  local_d8.elemsize._4_4_ = (int)local_d8.refcount;
  local_d8.allocator = (Allocator *)local_d8.data;
  local_d8.dims = (int)local_d8.refcount;
  local_d8.w = local_d8.refcount._4_4_;
  local_d8.c = local_d8.elempack;
  Mat::create(&local_d8,uVar26,_h,uVar17,0x20,8,opt->workspace_allocator);
  if (0 < (int)uVar3 >> 3) {
    lVar14 = 0x80;
    uVar18 = 0;
    do {
      if (0 < (int)_h) {
        ppp_Var19 = (_func_int ***)
                    ((long)(_func_int ***)local_d8.data +
                    local_d8.cstep * uVar18 *
                    CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize));
        uVar22 = 0;
        do {
          if (0 < (int)uVar4) {
            pauVar25 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar22 + lVar14);
            uVar16 = uVar32;
            do {
              auVar40 = vunpcklps_avx(pauVar25[-4],pauVar25[-3]);
              auVar50 = vunpckhps_avx(pauVar25[-4],pauVar25[-3]);
              auVar57 = vunpcklps_avx(pauVar25[-2],pauVar25[-1]);
              auVar52 = vunpckhps_avx(pauVar25[-2],pauVar25[-1]);
              auVar41 = vunpcklps_avx(*pauVar25,pauVar25[1]);
              auVar53 = vunpckhps_avx(*pauVar25,pauVar25[1]);
              auVar55 = vunpcklps_avx(pauVar25[2],pauVar25[3]);
              auVar54 = vunpckhps_avx(pauVar25[2],pauVar25[3]);
              auVar56 = vunpcklpd_avx(auVar40,auVar57);
              auVar40 = vunpckhpd_avx(auVar40,auVar57);
              auVar57 = vunpcklpd_avx(auVar50,auVar52);
              auVar50 = vunpckhpd_avx(auVar50,auVar52);
              auVar58 = vunpcklpd_avx(auVar41,auVar55);
              auVar52 = vunpckhpd_avx(auVar41,auVar55);
              auVar41 = vunpcklpd_avx(auVar53,auVar54);
              auVar53 = vunpckhpd_avx(auVar53,auVar54);
              auVar55._16_16_ = auVar58._0_16_;
              auVar55._0_16_ = auVar56._0_16_;
              auVar60._16_16_ = auVar52._0_16_;
              auVar60._0_16_ = auVar40._0_16_;
              auVar61._16_16_ = auVar41._0_16_;
              auVar61._0_16_ = auVar57._0_16_;
              auVar62._16_16_ = auVar53._0_16_;
              auVar62._0_16_ = auVar50._0_16_;
              auVar54 = vperm2f128_avx(auVar56,auVar58,0x31);
              auVar40 = vperm2f128_avx(auVar40,auVar52,0x31);
              auVar52 = vperm2f128_avx(auVar57,auVar41,0x31);
              auVar50 = vperm2f128_avx(auVar50,auVar53,0x31);
              *(undefined1 (*) [32])ppp_Var19 = auVar55;
              *(undefined1 (*) [32])(ppp_Var19 + 4) = auVar60;
              *(undefined1 (*) [32])(ppp_Var19 + 8) = auVar61;
              *(undefined1 (*) [32])(ppp_Var19 + 0xc) = auVar62;
              *(undefined1 (*) [32])(ppp_Var19 + 0x10) = auVar54;
              *(undefined1 (*) [32])(ppp_Var19 + 0x14) = auVar40;
              *(undefined1 (*) [32])(ppp_Var19 + 0x18) = auVar52;
              *(undefined1 (*) [32])(ppp_Var19 + 0x1c) = auVar50;
              ppp_Var19 = ppp_Var19 + 0x20;
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + (long)(int)(uVar3 * 8) * 4);
              uVar26 = (int)uVar16 - 1;
              uVar16 = (ulong)uVar26;
            } while (uVar26 != 0);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar15);
      }
      uVar18 = uVar18 + 1;
      lVar14 = lVar14 + 0x100;
    } while (uVar18 != (uint)((int)uVar3 >> 3));
  }
  uVar18 = uVar30 & 0xfffffffffffffff8;
  if ((uint)uVar18 != uVar3) {
    lVar14 = uVar18 << 5;
    do {
      if (0 < (int)_h) {
        uVar26 = (uint)uVar18;
        uVar17 = uVar26 + 7;
        if (-1 < (int)uVar26) {
          uVar17 = uVar26;
        }
        ppp_Var19 = (_func_int ***)
                    ((long)(_func_int ***)local_d8.data +
                    (long)(int)(((int)uVar17 >> 3) + (uVar26 - (uVar17 & 0xfffffff8))) *
                    local_d8.cstep * CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize)
                    );
        uVar22 = 0;
        do {
          if (0 < (int)uVar4) {
            pauVar25 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar22 + lVar14);
            uVar16 = uVar32;
            do {
              *(undefined1 (*) [32])ppp_Var19 = *pauVar25;
              ppp_Var19 = ppp_Var19 + 4;
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + (long)(int)(uVar3 * 8) * 4);
              uVar26 = (int)uVar16 - 1;
              uVar16 = (ulong)uVar26;
            } while (uVar26 != 0);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar15);
      }
      uVar18 = uVar18 + 1;
      lVar14 = lVar14 + 0x20;
    } while ((long)uVar18 < (long)uVar30);
  }
  uVar26 = (uint)local_80;
  uVar17 = uVar26 + 7;
  if (-1 < (int)uVar26) {
    uVar17 = uVar26;
  }
  if (7 < (int)uVar26) {
    iVar13 = _h * uVar4 * 8;
    local_68 = (ulong)(uint)((int)uVar17 >> 3);
    uVar18 = 0;
    do {
      sVar6 = top_blob->cstep;
      pvVar7 = top_blob->data;
      sVar8 = top_blob->elemsize;
      local_f8 = (undefined1 (*) [32])(uVar18 * 8 * sVar6 * sVar8 + (long)pvVar7);
      pauVar27 = (undefined1 (*) [32])((uVar18 * 8 + 1) * sVar6 * sVar8 + (long)pvVar7);
      pauVar28 = (undefined1 (*) [32])((uVar18 * 8 + 2) * sVar6 * sVar8 + (long)pvVar7);
      pauVar29 = (undefined1 (*) [32])((uVar18 * 8 + 3) * sVar6 * sVar8 + (long)pvVar7);
      pauVar12 = (undefined1 (*) [32])((uVar18 * 8 + 4) * sVar6 * sVar8 + (long)pvVar7);
      pauVar23 = (undefined1 (*) [32])((uVar18 * 8 + 5) * sVar6 * sVar8 + (long)pvVar7);
      pauVar20 = (undefined1 (*) [32])((uVar18 * 8 + 6) * sVar6 * sVar8 + (long)pvVar7);
      pauVar33 = (undefined1 (*) [32])((uVar18 * 8 + 7) * sVar6 * sVar8 + (long)pvVar7);
      pauVar25 = (undefined1 (*) [32])(uVar18 * 0x20 + (long)pvVar5);
      local_70 = pauVar25;
      if (pvVar5 == (void *)0x0) {
        local_70 = (undefined1 (*) [32])&local_58;
      }
      local_58 = 0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      if ((int)uVar3 < 8) {
        uVar22 = 0;
      }
      else {
        if (pvVar5 == (void *)0x0) {
          pauVar25 = (undefined1 (*) [32])&local_58;
        }
        lVar14 = 0;
        uVar16 = 0;
        do {
          uVar2 = *(undefined4 *)*local_70;
          auVar58._4_4_ = (float)uVar2;
          auVar58._0_4_ = (float)uVar2;
          auVar58._8_4_ = (float)uVar2;
          auVar58._12_4_ = (float)uVar2;
          auVar58._16_4_ = (float)uVar2;
          auVar58._20_4_ = (float)uVar2;
          auVar58._24_4_ = (float)uVar2;
          auVar58._28_4_ = (float)uVar2;
          uVar2 = *(undefined4 *)(*pauVar25 + 4);
          auVar57._4_4_ = (float)uVar2;
          auVar57._0_4_ = (float)uVar2;
          auVar57._8_4_ = (float)uVar2;
          auVar57._12_4_ = (float)uVar2;
          auVar57._16_4_ = (float)uVar2;
          auVar57._20_4_ = (float)uVar2;
          auVar57._24_4_ = (float)uVar2;
          auVar57._28_4_ = (float)uVar2;
          uVar2 = *(undefined4 *)(*pauVar25 + 8);
          auVar56._4_4_ = (float)uVar2;
          auVar56._0_4_ = (float)uVar2;
          auVar56._8_4_ = (float)uVar2;
          auVar56._12_4_ = (float)uVar2;
          auVar56._16_4_ = (float)uVar2;
          auVar56._20_4_ = (float)uVar2;
          auVar56._24_4_ = (float)uVar2;
          auVar56._28_4_ = (float)uVar2;
          uVar2 = *(undefined4 *)(*pauVar25 + 0xc);
          auVar54._4_4_ = (float)uVar2;
          auVar54._0_4_ = (float)uVar2;
          auVar54._8_4_ = (float)uVar2;
          auVar54._12_4_ = (float)uVar2;
          auVar54._16_4_ = (float)uVar2;
          auVar54._20_4_ = (float)uVar2;
          auVar54._24_4_ = (float)uVar2;
          auVar54._28_4_ = (float)uVar2;
          uVar2 = *(undefined4 *)(*pauVar25 + 0x10);
          auVar53._4_4_ = (float)uVar2;
          auVar53._0_4_ = (float)uVar2;
          auVar53._8_4_ = (float)uVar2;
          auVar53._12_4_ = (float)uVar2;
          auVar53._16_4_ = (float)uVar2;
          auVar53._20_4_ = (float)uVar2;
          auVar53._24_4_ = (float)uVar2;
          auVar53._28_4_ = (float)uVar2;
          uVar2 = *(undefined4 *)(*pauVar25 + 0x14);
          auVar52._4_4_ = (float)uVar2;
          auVar52._0_4_ = (float)uVar2;
          auVar52._8_4_ = (float)uVar2;
          auVar52._12_4_ = (float)uVar2;
          auVar52._16_4_ = (float)uVar2;
          auVar52._20_4_ = (float)uVar2;
          auVar52._24_4_ = (float)uVar2;
          auVar52._28_4_ = (float)uVar2;
          uVar2 = *(undefined4 *)(*pauVar25 + 0x18);
          auVar50._4_4_ = (float)uVar2;
          auVar50._0_4_ = (float)uVar2;
          auVar50._8_4_ = (float)uVar2;
          auVar50._12_4_ = (float)uVar2;
          auVar50._16_4_ = (float)uVar2;
          auVar50._20_4_ = (float)uVar2;
          auVar50._24_4_ = (float)uVar2;
          auVar50._28_4_ = (float)uVar2;
          uVar2 = *(undefined4 *)(*pauVar25 + 0x1c);
          auVar40._4_4_ = (float)uVar2;
          auVar40._0_4_ = (float)uVar2;
          auVar40._8_4_ = (float)uVar2;
          auVar40._12_4_ = (float)uVar2;
          auVar40._16_4_ = (float)uVar2;
          auVar40._20_4_ = (float)uVar2;
          auVar40._24_4_ = (float)uVar2;
          auVar40._28_4_ = (float)uVar2;
          if (0 < iVar13) {
            lVar35 = kernel->cstep * uVar18 * kernel->elemsize;
            pvVar7 = kernel->data;
            lVar21 = 0;
            iVar24 = iVar13;
            auVar41 = auVar40;
            auVar55 = auVar50;
            auVar60 = auVar52;
            auVar61 = auVar53;
            auVar62 = auVar54;
            auVar42 = auVar56;
            auVar51 = auVar57;
            auVar59 = auVar58;
            do {
              pfVar31 = (float *)((long)(_func_int ***)local_d8.data +
                                 lVar21 + local_d8.cstep *
                                          CONCAT44(local_d8.elemsize._4_4_,
                                                   (undefined4)local_d8.elemsize) * lVar14);
              fVar44 = *pfVar31;
              fVar45 = pfVar31[1];
              fVar46 = pfVar31[2];
              fVar47 = pfVar31[3];
              fVar48 = pfVar31[4];
              fVar49 = pfVar31[5];
              fVar10 = pfVar31[6];
              fVar37 = *(float *)((long)pvVar7 + lVar21 + lVar35);
              fVar43 = *(float *)((long)pvVar7 + lVar21 + lVar35 + 4);
              auVar58._0_4_ = fVar37 * fVar44 + auVar59._0_4_;
              auVar58._4_4_ = fVar37 * fVar45 + auVar59._4_4_;
              auVar58._8_4_ = fVar37 * fVar46 + auVar59._8_4_;
              auVar58._12_4_ = fVar37 * fVar47 + auVar59._12_4_;
              auVar58._16_4_ = fVar37 * fVar48 + auVar59._16_4_;
              auVar58._20_4_ = fVar37 * fVar49 + auVar59._20_4_;
              auVar58._24_4_ = fVar37 * fVar10 + auVar59._24_4_;
              auVar58._28_4_ = fVar37 + auVar59._28_4_;
              auVar57._0_4_ = fVar43 * fVar44 + auVar51._0_4_;
              auVar57._4_4_ = fVar43 * fVar45 + auVar51._4_4_;
              auVar57._8_4_ = fVar43 * fVar46 + auVar51._8_4_;
              auVar57._12_4_ = fVar43 * fVar47 + auVar51._12_4_;
              auVar57._16_4_ = fVar43 * fVar48 + auVar51._16_4_;
              auVar57._20_4_ = fVar43 * fVar49 + auVar51._20_4_;
              auVar57._24_4_ = fVar43 * fVar10 + auVar51._24_4_;
              auVar57._28_4_ = fVar37 + auVar51._28_4_;
              fVar37 = *(float *)((long)pvVar7 + lVar21 + lVar35 + 8);
              fVar43 = *(float *)((long)pvVar7 + lVar21 + lVar35 + 0xc);
              auVar56._0_4_ = fVar37 * fVar44 + auVar42._0_4_;
              auVar56._4_4_ = fVar37 * fVar45 + auVar42._4_4_;
              auVar56._8_4_ = fVar37 * fVar46 + auVar42._8_4_;
              auVar56._12_4_ = fVar37 * fVar47 + auVar42._12_4_;
              auVar56._16_4_ = fVar37 * fVar48 + auVar42._16_4_;
              auVar56._20_4_ = fVar37 * fVar49 + auVar42._20_4_;
              auVar56._24_4_ = fVar37 * fVar10 + auVar42._24_4_;
              auVar56._28_4_ = fVar37 + auVar42._28_4_;
              auVar54._0_4_ = fVar43 * fVar44 + auVar62._0_4_;
              auVar54._4_4_ = fVar43 * fVar45 + auVar62._4_4_;
              auVar54._8_4_ = fVar43 * fVar46 + auVar62._8_4_;
              auVar54._12_4_ = fVar43 * fVar47 + auVar62._12_4_;
              auVar54._16_4_ = fVar43 * fVar48 + auVar62._16_4_;
              auVar54._20_4_ = fVar43 * fVar49 + auVar62._20_4_;
              auVar54._24_4_ = fVar43 * fVar10 + auVar62._24_4_;
              auVar54._28_4_ = fVar37 + auVar62._28_4_;
              fVar37 = *(float *)((long)pvVar7 + lVar21 + lVar35 + 0x10);
              fVar43 = *(float *)((long)pvVar7 + lVar21 + lVar35 + 0x14);
              auVar53._0_4_ = fVar37 * fVar44 + auVar61._0_4_;
              auVar53._4_4_ = fVar37 * fVar45 + auVar61._4_4_;
              auVar53._8_4_ = fVar37 * fVar46 + auVar61._8_4_;
              auVar53._12_4_ = fVar37 * fVar47 + auVar61._12_4_;
              auVar53._16_4_ = fVar37 * fVar48 + auVar61._16_4_;
              auVar53._20_4_ = fVar37 * fVar49 + auVar61._20_4_;
              auVar53._24_4_ = fVar37 * fVar10 + auVar61._24_4_;
              auVar53._28_4_ = fVar37 + auVar61._28_4_;
              auVar52._0_4_ = fVar43 * fVar44 + auVar60._0_4_;
              auVar52._4_4_ = fVar43 * fVar45 + auVar60._4_4_;
              auVar52._8_4_ = fVar43 * fVar46 + auVar60._8_4_;
              auVar52._12_4_ = fVar43 * fVar47 + auVar60._12_4_;
              auVar52._16_4_ = fVar43 * fVar48 + auVar60._16_4_;
              auVar52._20_4_ = fVar43 * fVar49 + auVar60._20_4_;
              auVar52._24_4_ = fVar43 * fVar10 + auVar60._24_4_;
              auVar52._28_4_ = fVar37 + auVar60._28_4_;
              fVar37 = *(float *)((long)pvVar7 + lVar21 + lVar35 + 0x18);
              fVar43 = *(float *)((long)pvVar7 + lVar21 + lVar35 + 0x1c);
              auVar50._0_4_ = fVar37 * fVar44 + auVar55._0_4_;
              auVar50._4_4_ = fVar37 * fVar45 + auVar55._4_4_;
              auVar50._8_4_ = fVar37 * fVar46 + auVar55._8_4_;
              auVar50._12_4_ = fVar37 * fVar47 + auVar55._12_4_;
              auVar50._16_4_ = fVar37 * fVar48 + auVar55._16_4_;
              auVar50._20_4_ = fVar37 * fVar49 + auVar55._20_4_;
              auVar50._24_4_ = fVar37 * fVar10 + auVar55._24_4_;
              auVar50._28_4_ = fVar37 + auVar55._28_4_;
              auVar40._0_4_ = fVar43 * fVar44 + auVar41._0_4_;
              auVar40._4_4_ = fVar43 * fVar45 + auVar41._4_4_;
              auVar40._8_4_ = fVar43 * fVar46 + auVar41._8_4_;
              auVar40._12_4_ = fVar43 * fVar47 + auVar41._12_4_;
              auVar40._16_4_ = fVar43 * fVar48 + auVar41._16_4_;
              auVar40._20_4_ = fVar43 * fVar49 + auVar41._20_4_;
              auVar40._24_4_ = fVar43 * fVar10 + auVar41._24_4_;
              auVar40._28_4_ = pfVar31[7] + auVar41._28_4_;
              lVar21 = lVar21 + 0x20;
              iVar24 = iVar24 + -1;
              auVar41 = auVar40;
              auVar55 = auVar50;
              auVar60 = auVar52;
              auVar61 = auVar53;
              auVar62 = auVar54;
              auVar42 = auVar56;
              auVar51 = auVar57;
              auVar59 = auVar58;
            } while (iVar24 != 0);
          }
          *local_f8 = auVar58;
          *pauVar27 = auVar57;
          *pauVar28 = auVar56;
          *pauVar29 = auVar54;
          *pauVar12 = auVar53;
          *pauVar23 = auVar52;
          *pauVar20 = auVar50;
          *pauVar33 = auVar40;
          local_f8 = local_f8 + 1;
          pauVar27 = pauVar27 + 1;
          pauVar28 = pauVar28 + 1;
          pauVar29 = pauVar29 + 1;
          pauVar12 = pauVar12 + 1;
          pauVar23 = pauVar23 + 1;
          pauVar20 = pauVar20 + 1;
          pauVar33 = pauVar33 + 1;
          uVar22 = uVar16 + 8;
          lVar21 = uVar16 + 0xf;
          lVar14 = lVar14 + 1;
          uVar16 = uVar22;
        } while (lVar21 < (long)uVar30);
      }
      if ((int)uVar22 < (int)uVar3) {
        sVar6 = kernel->cstep;
        sVar8 = kernel->elemsize;
        pvVar7 = kernel->data;
        do {
          auVar41 = *local_70;
          if (0 < (int)(_h * uVar4 * 8)) {
            lVar14 = 0;
            pfVar31 = (float *)(sVar6 * uVar18 * sVar8 + (long)pvVar7);
            auVar40 = auVar41;
            do {
              fVar37 = *(float *)((long)(_func_int ***)local_d8.data +
                                 lVar14 * 4 +
                                 (ulong)(((uint)uVar22 & 7) + ((uint)(uVar22 >> 3) & 0x1fffffff)) *
                                 local_d8.cstep *
                                 CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize));
              auVar41._0_4_ = fVar37 * *pfVar31 + auVar40._0_4_;
              auVar41._4_4_ = fVar37 * pfVar31[1] + auVar40._4_4_;
              auVar41._8_4_ = fVar37 * pfVar31[2] + auVar40._8_4_;
              auVar41._12_4_ = fVar37 * pfVar31[3] + auVar40._12_4_;
              auVar41._16_4_ = fVar37 * pfVar31[4] + auVar40._16_4_;
              auVar41._20_4_ = fVar37 * pfVar31[5] + auVar40._20_4_;
              auVar41._24_4_ = fVar37 * pfVar31[6] + auVar40._24_4_;
              auVar41._28_4_ = fVar37 + auVar40._28_4_;
              pfVar31 = pfVar31 + 8;
              lVar14 = lVar14 + 1;
              auVar40 = auVar41;
            } while (iVar13 != (int)lVar14);
          }
          *(int *)*local_f8 = auVar41._0_4_;
          auVar36 = auVar41._0_16_;
          uVar2 = vextractps_avx(auVar36,1);
          *(undefined4 *)*pauVar27 = uVar2;
          uVar2 = vextractps_avx(auVar36,2);
          *(undefined4 *)*pauVar28 = uVar2;
          uVar2 = vextractps_avx(auVar36,3);
          *(undefined4 *)*pauVar29 = uVar2;
          auVar36 = auVar41._16_16_;
          *(int *)*pauVar12 = auVar41._16_4_;
          uVar2 = vextractps_avx(auVar36,1);
          *(undefined4 *)*pauVar23 = uVar2;
          uVar2 = vextractps_avx(auVar36,2);
          *(undefined4 *)*pauVar20 = uVar2;
          uVar2 = vextractps_avx(auVar36,3);
          *(undefined4 *)*pauVar33 = uVar2;
          local_f8 = (undefined1 (*) [32])((long)*local_f8 + 4);
          pauVar27 = (undefined1 (*) [32])((long)*pauVar27 + 4);
          pauVar28 = (undefined1 (*) [32])((long)*pauVar28 + 4);
          pauVar29 = (undefined1 (*) [32])((long)*pauVar29 + 4);
          pauVar12 = (undefined1 (*) [32])((long)*pauVar12 + 4);
          pauVar23 = (undefined1 (*) [32])((long)*pauVar23 + 4);
          pauVar20 = (undefined1 (*) [32])((long)*pauVar20 + 4);
          pauVar33 = (undefined1 (*) [32])((long)*pauVar33 + 4);
          uVar34 = (uint)uVar22 + 1;
          uVar22 = (ulong)uVar34;
        } while (uVar34 != uVar3);
      }
      uVar18 = uVar18 + 1;
      local_78 = uVar30;
      local_60 = top_blob;
    } while (uVar18 != local_68);
  }
  if ((int)(uVar17 & 0xfffffff8) < (int)uVar26) {
    iVar13 = _h * uVar4 * 8;
    lVar14 = (long)(int)(uVar17 & 0xfffffff8);
    do {
      if (pvVar5 == (void *)0x0) {
        auVar36 = ZEXT816(0) << 0x40;
      }
      else {
        auVar36 = ZEXT416(*(uint *)((long)pvVar5 + lVar14 * 4));
      }
      pauVar25 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar14 * top_blob->elemsize + (long)top_blob->data);
      uVar18 = 0;
      uVar26 = (uint)lVar14;
      if (7 < (int)uVar3) {
        uVar17 = uVar26 + 7;
        if (-1 < (int)uVar26) {
          uVar17 = uVar26;
        }
        auVar9 = vshufps_avx(auVar36,auVar36,0);
        auVar42._16_16_ = auVar9;
        auVar42._0_16_ = auVar9;
        uVar22 = 0;
        do {
          auVar51 = auVar42;
          if (0 < iVar13) {
            ppp_Var19 = (_func_int ***)
                        ((long)(_func_int ***)local_d8.data +
                        (uVar22 >> 3) * local_d8.cstep *
                        CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize));
            lVar21 = 0;
            auVar40 = auVar42;
            do {
              fVar37 = *(float *)((long)kernel->data +
                                 lVar21 * 4 +
                                 kernel->cstep *
                                 (long)(int)(((int)uVar17 >> 3) + (uVar26 - (uVar17 & 0xfffffff8)))
                                 * kernel->elemsize);
              auVar51._0_4_ = fVar37 * *(float *)ppp_Var19 + auVar40._0_4_;
              auVar51._4_4_ = fVar37 * *(float *)((long)ppp_Var19 + 4) + auVar40._4_4_;
              auVar51._8_4_ = fVar37 * *(float *)(ppp_Var19 + 1) + auVar40._8_4_;
              auVar51._12_4_ = fVar37 * *(float *)((long)(ppp_Var19 + 1) + 4) + auVar40._12_4_;
              auVar51._16_4_ = fVar37 * *(float *)(ppp_Var19 + 2) + auVar40._16_4_;
              auVar51._20_4_ = fVar37 * *(float *)((long)(ppp_Var19 + 2) + 4) + auVar40._20_4_;
              auVar51._24_4_ = fVar37 * *(float *)(ppp_Var19 + 3) + auVar40._24_4_;
              auVar51._28_4_ = fVar37 + auVar40._28_4_;
              ppp_Var19 = ppp_Var19 + 4;
              lVar21 = lVar21 + 1;
              auVar40 = auVar51;
            } while (iVar13 != (int)lVar21);
          }
          *pauVar25 = auVar51;
          pauVar25 = pauVar25 + 1;
          uVar18 = uVar22 + 8;
          lVar21 = uVar22 + 0xf;
          uVar22 = uVar18;
        } while (lVar21 < (long)uVar30);
      }
      if ((int)uVar18 < (int)uVar3) {
        uVar17 = uVar26 + 7;
        if (-1 < (int)uVar26) {
          uVar17 = uVar26;
        }
        sVar6 = kernel->cstep;
        sVar8 = kernel->elemsize;
        pvVar7 = kernel->data;
        do {
          if ((int)(_h * uVar4) < 1) {
            fVar37 = 0.0;
            fVar43 = 0.0;
            fVar44 = 0.0;
            fVar45 = 0.0;
            fVar46 = 0.0;
            fVar47 = 0.0;
            fVar48 = 0.0;
            fVar49 = 0.0;
          }
          else {
            fVar37 = 0.0;
            fVar43 = 0.0;
            fVar44 = 0.0;
            fVar45 = 0.0;
            fVar46 = 0.0;
            fVar47 = 0.0;
            fVar48 = 0.0;
            fVar49 = 0.0;
            lVar21 = 0;
            iVar24 = _h * uVar4;
            do {
              pfVar31 = (float *)((long)pvVar7 +
                                 lVar21 + (long)(int)(((int)uVar17 >> 3) +
                                                     (uVar26 - (uVar17 & 0xfffffff8))) * sVar6 *
                                          sVar8);
              pfVar1 = (float *)((long)(_func_int ***)local_d8.data +
                                lVar21 + (ulong)(((uint)uVar18 & 7) +
                                                ((uint)(uVar18 >> 3) & 0x1fffffff)) *
                                         local_d8.cstep *
                                         CONCAT44(local_d8.elemsize._4_4_,
                                                  (undefined4)local_d8.elemsize));
              fVar37 = *pfVar31 * *pfVar1 + fVar37;
              fVar43 = pfVar31[1] * pfVar1[1] + fVar43;
              fVar44 = pfVar31[2] * pfVar1[2] + fVar44;
              fVar45 = pfVar31[3] * pfVar1[3] + fVar45;
              fVar46 = pfVar31[4] * pfVar1[4] + fVar46;
              fVar47 = pfVar31[5] * pfVar1[5] + fVar47;
              fVar48 = pfVar31[6] * pfVar1[6] + fVar48;
              fVar49 = pfVar31[7] + fVar49;
              lVar21 = lVar21 + 0x20;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          auVar38._0_4_ = fVar46 + fVar37;
          auVar38._4_4_ = fVar47 + fVar43;
          auVar38._8_4_ = fVar48 + fVar44;
          auVar38._12_4_ = fVar49 + fVar45;
          auVar9 = vshufpd_avx(auVar38,auVar38,1);
          auVar39._0_4_ = auVar9._0_4_ + auVar38._0_4_;
          auVar39._4_4_ = auVar9._4_4_ + auVar38._4_4_;
          auVar39._8_4_ = auVar9._8_4_ + auVar38._8_4_;
          auVar39._12_4_ = auVar9._12_4_ + auVar38._12_4_;
          auVar9 = vmovshdup_avx(auVar39);
          *(float *)*pauVar25 = auVar9._0_4_ + auVar36._0_4_ + auVar39._0_4_;
          pauVar25 = (undefined1 (*) [32])((long)*pauVar25 + 4);
          uVar34 = (uint)uVar18 + 1;
          uVar18 = (ulong)uVar34;
        } while (uVar34 != uVar3);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != local_80);
  }
  piVar11 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      local_90 = uVar32;
      local_88 = uVar15;
      if (local_d8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_d8.data != (Allocator *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to1_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u * 8, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + size % 8, 4u * 8, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u * 8, 8, opt.workspace_allocator);
    {
        int remain_size_start = 0;
        int nn_size = size >> 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 8x8
                    __m256 _r0 = _mm256_load_ps(img0);
                    __m256 _r1 = _mm256_load_ps(img0 + 8);
                    __m256 _r2 = _mm256_load_ps(img0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(img0 + 8 * 3);
                    __m256 _r4 = _mm256_load_ps(img0 + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(img0 + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(img0 + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(img0 + 8 * 7);

                    __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                    __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                    __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                    __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                    __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                    __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                    __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                    __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                    __m256 _tmp8 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp9 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpa = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpb = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpc = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpd = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpe = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpf = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                    _r0 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 2, 0, 0));
                    _r1 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                    _r2 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 2, 0, 0));
                    _r3 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                    _r4 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 3, 0, 1));
                    _r5 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                    _r6 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 3, 0, 1));
                    _r7 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);
                    _mm256_store_ps(tmpptr + 8 * 4, _r4);
                    _mm256_store_ps(tmpptr + 8 * 5, _r5);
                    _mm256_store_ps(tmpptr + 8 * 6, _r6);
                    _mm256_store_ps(tmpptr + 8 * 7, _r7);

                    img0 += size * 8;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _val = _mm256_load_ps(img0);
                    _mm256_store_ps(tmpptr, _val);

                    img0 += size * 8;
                    tmpptr += 8;
                }
            }
        }
    }

    int nn_outch = outch / 8;
    int remain_outch_start = nn_outch * 8;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 8;

        float* outptr0 = top_blob.channel(p);
        float* outptr1 = top_blob.channel(p + 1);
        float* outptr2 = top_blob.channel(p + 2);
        float* outptr3 = top_blob.channel(p + 3);
        float* outptr4 = top_blob.channel(p + 4);
        float* outptr5 = top_blob.channel(p + 5);
        float* outptr6 = top_blob.channel(p + 6);
        float* outptr7 = top_blob.channel(p + 7);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p / 8);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum0 = _mm256_broadcast_ss(biasptr);
            __m256 _sum1 = _mm256_broadcast_ss(biasptr + 1);
            __m256 _sum2 = _mm256_broadcast_ss(biasptr + 2);
            __m256 _sum3 = _mm256_broadcast_ss(biasptr + 3);
            __m256 _sum4 = _mm256_broadcast_ss(biasptr + 4);
            __m256 _sum5 = _mm256_broadcast_ss(biasptr + 5);
            __m256 _sum6 = _mm256_broadcast_ss(biasptr + 6);
            __m256 _sum7 = _mm256_broadcast_ss(biasptr + 7);

            for (int j = 0; j < nn; j++)
            {
                __m256 _val0 = _mm256_load_ps(tmpptr);

                __m256 _w0 = _mm256_broadcast_ss(kptr0);
                __m256 _w1 = _mm256_broadcast_ss(kptr0 + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val0, _w1, _sum1);
                __m256 _w2 = _mm256_broadcast_ss(kptr0 + 2);
                __m256 _w3 = _mm256_broadcast_ss(kptr0 + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val0, _w2, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val0, _w3, _sum3);
                __m256 _w4 = _mm256_broadcast_ss(kptr0 + 4);
                __m256 _w5 = _mm256_broadcast_ss(kptr0 + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val0, _w4, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val0, _w5, _sum5);
                __m256 _w6 = _mm256_broadcast_ss(kptr0 + 6);
                __m256 _w7 = _mm256_broadcast_ss(kptr0 + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val0, _w6, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val0, _w7, _sum7);

                tmpptr += 8;
                kptr0 += 8;
            }

            _mm256_storeu_ps(outptr0, _sum0);
            _mm256_storeu_ps(outptr1, _sum1);
            _mm256_storeu_ps(outptr2, _sum2);
            _mm256_storeu_ps(outptr3, _sum3);
            _mm256_storeu_ps(outptr4, _sum4);
            _mm256_storeu_ps(outptr5, _sum5);
            _mm256_storeu_ps(outptr6, _sum6);
            _mm256_storeu_ps(outptr7, _sum7);

            outptr0 += 8;
            outptr1 += 8;
            outptr2 += 8;
            outptr3 += 8;
            outptr4 += 8;
            outptr5 += 8;
            outptr6 += 8;
            outptr7 += 8;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + i % 8);
            const float* kptr0 = kernel.channel(p / 8);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _w0 = _mm256_load_ps(kptr0);
                _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr0 += 8;
            }

            float sum[8];
            _mm256_storeu_ps(sum, _sum);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr4[0] = sum[4];
            outptr5[0] = sum[5];
            outptr6[0] = sum[6];
            outptr7[0] = sum[7];

            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
            outptr4 += 1;
            outptr5 += 1;
            outptr6 += 1;
            outptr7 += 1;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p / 8 + p % 8);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum0 = _mm256_set1_ps(bias0);

            for (int j = 0; j < nn; j++)
            {
                __m256 _val0 = _mm256_load_ps(tmpptr);
                __m256 _w0 = _mm256_broadcast_ss(kptr0);
                _sum0 = _mm256_comp_fmadd_ps(_w0, _val0, _sum0);

                tmpptr += 8;
                kptr0 += 1;
            }

            _mm256_storeu_ps(outptr0, _sum0);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + i % 8);
            const float* kptr0 = kernel.channel(p / 8 + p % 8);

            int nn = inch * maxk; // inch always > 0

            float sum0 = bias0;

            __m256 _sum0 = _mm256_setzero_ps();

            for (int j = 0; j < nn; j++)
            {
                __m256 _val0 = _mm256_load_ps(tmpptr);
                __m256 _w0 = _mm256_load_ps(kptr0);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

                tmpptr += 8;
                kptr0 += 8;
            }

            sum0 += _mm256_reduce_add_ps(_sum0);

            outptr0[0] = sum0;
            outptr0 += 1;
        }
    }
}